

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem_unix.c
# Opt level: O3

void w_vmem_destroy(w_vmem *mem,size_t size)

{
  int iVar1;
  size_t *in_RAX;
  int *piVar2;
  wp_vmem_trace_data *trace_data;
  size_t *local_28;
  
  local_28 = in_RAX;
  iVar1 = w_mtx_lock(&wp_vmem_tracer_mtx);
  if (iVar1 != 0) {
    w_abort(-8);
  }
  wp_trace_pool_find_data
            (&local_28,wp_vmem_tracer_inst.idx_pool,wp_vmem_tracer_inst.data_pool,0x400,8,mem);
  iVar1 = w_mtx_unlock(&wp_vmem_tracer_mtx);
  if (iVar1 != 0) {
    w_abort(-0xc);
  }
  if (*local_28 != size) {
    w_handle_failed_assertion
              ("size == trace_data->size","w_vmem_destroy",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x85);
  }
  if (mem == (w_vmem *)0x0) {
    w_handle_failed_assertion
              ("mem != NULL","w_vmem_destroy",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x89);
  }
  if (mem->addr == (void *)0x0) {
    w_handle_failed_assertion
              ("mem->addr != NULL","w_vmem_destroy",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x8a);
  }
  if (size == 0) {
    w_handle_failed_assertion
              ("size > 0","w_vmem_destroy",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x8b);
  }
  if (w_get_alloc_granularity::granularity == 0) {
    w_get_alloc_granularity::granularity = sysconf(0x1e);
  }
  if (size % w_get_alloc_granularity::granularity != 0) {
    w_handle_failed_assertion
              ("size % w_get_alloc_granularity() == 0","w_vmem_destroy",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x8c);
  }
  iVar1 = munmap(mem->addr,size);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    wp_log(W_LOG_LVL_WARNING,
           "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
           ,0x93,"failed to release %zu bytes of virtual memory at %p\n",size,mem->addr);
    wp_log_system_error(W_LOG_LVL_ALL,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
                        ,0x94,iVar1);
  }
  iVar1 = w_mtx_lock(&wp_vmem_tracer_mtx);
  if (iVar1 != 0) {
    w_abort(-8);
  }
  wp_trace_pool_remove_data(wp_vmem_tracer_inst.idx_pool,0x400,mem);
  iVar1 = w_mtx_unlock(&wp_vmem_tracer_mtx);
  if (iVar1 != 0) {
    w_abort(-0xc);
  }
  return;
}

Assistant:

void
w_vmem_destroy(
    struct w_vmem *mem,
    size_t size
)
{
#if W_TRACING(ENABLED)
    {
        struct wp_vmem_trace_data *trace_data;

        W_TRACER_FIND_DATA(wp_vmem_tracer, &trace_data, mem);
        W_ASSERT(size == trace_data->size);
    }
#endif

    W_ASSERT(mem != NULL);
    W_ASSERT(mem->addr != NULL);
    W_ASSERT(size > 0);
    W_ASSERT(size % w_get_alloc_granularity() == 0);

    if (munmap(mem->addr, size) != 0)
    {
        int error;

        error = errno;
        W_LOG_WARNING(WP_VMEM_GET_ERROR_MSG("release"), size, mem->addr);
        W_LOG_SYSTEM_ERROR(W_LOG_LVL_DEBUG, error);
    }

#if W_TRACING(ENABLED)
    {
        W_TRACER_DETACH_DATA(wp_vmem_tracer, mem);
    }
#endif
}